

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O3

double __thiscall Clasp::ClaspFacade::SolveData::BoundArray::_at(BoundArray *this,uint32_t idx)

{
  long lVar1;
  wsum_t wVar2;
  ulong uVar3;
  double dVar4;
  
  uVar3 = (this->data->en).ptr_ & 0xfffffffffffffffe;
  if (((uVar3 != 0) && (lVar1 = *(long *)(uVar3 + 8), lVar1 != 0)) && (idx < *(uint *)(lVar1 + 8)))
  {
    wVar2 = _bound(this->data,this->type,idx);
    if (wVar2 == 0x7fffffffffffffff) {
      dVar4 = INFINITY;
    }
    else {
      dVar4 = (double)wVar2;
    }
    return dVar4;
  }
  Potassco::fail(-2,"double Clasp::ClaspFacade::SolveData::BoundArray::_at(uint32_t) const",0x1c6,
                 "idx < size()","expired key",0);
}

Assistant:

double _at(uint32_t idx) const {
			POTASSCO_REQUIRE(idx < size(), "expired key");
			const wsum_t bound = data->_bound(type, idx);
			return bound != SharedMinimizeData::maxBound()
				? static_cast<double>(bound)
				: std::numeric_limits<double>::infinity();
		}